

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtok.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  char local_16 [8];
  char s [10];
  
  s[2] = '\0';
  s[3] = '\0';
  s[4] = '\0';
  s[5] = '\0';
  builtin_strncpy(local_16,"_a_bc__d",8);
  s[0] = '_';
  s[1] = '\0';
  pcVar1 = strtok(local_16,"_");
  if (pcVar1 != local_16 + 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x27,"strtok( s, \"_\" ) == &s[1]");
  }
  if (local_16[1] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x28,"s[1] == \'a\'");
  }
  if (local_16[2] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x29,"s[2] == \'\\0\'");
  }
  pcVar1 = strtok((char *)0x0,"_");
  if (pcVar1 != local_16 + 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2a,"strtok( NULL, \"_\" ) == &s[3]");
  }
  if (local_16[3] != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2b,"s[3] == \'b\'");
  }
  if (local_16[4] != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2c,"s[4] == \'c\'");
  }
  if (local_16[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2d,"s[5] == \'\\0\'");
  }
  pcVar1 = strtok((char *)0x0,"_");
  if (pcVar1 != local_16 + 7) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2e,"strtok( NULL, \"_\" ) == &s[7]");
  }
  if (local_16[6] != '_') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2f,"s[6] == \'_\'");
  }
  if (local_16[7] != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x30,"s[7] == \'d\'");
  }
  if (s[0] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x31,"s[8] == \'\\0\'");
  }
  pcVar1 = strtok((char *)0x0,"_");
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x32,"strtok( NULL, \"_\" ) == NULL");
  }
  strcpy(local_16,"ab_cd");
  pcVar1 = strtok(local_16,"_");
  if (pcVar1 != local_16) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x34,"strtok( s, \"_\" ) == &s[0]");
  }
  if (local_16[0] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x35,"s[0] == \'a\'");
  }
  if (local_16[1] != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x36,"s[1] == \'b\'");
  }
  if (local_16[2] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x37,"s[2] == \'\\0\'");
  }
  pcVar1 = strtok((char *)0x0,"_");
  if (pcVar1 != local_16 + 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x38,"strtok( NULL, \"_\" ) == &s[3]");
  }
  if (local_16[3] != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x39,"s[3] == \'c\'");
  }
  if (local_16[4] != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3a,"s[4] == \'d\'");
  }
  if (local_16[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3b,"s[5] == \'\\0\'");
  }
  pcVar1 = strtok((char *)0x0,"_");
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3c,"strtok( NULL, \"_\" ) == NULL");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "_a_bc__d_";
    TESTCASE( strtok( s, "_" ) == &s[1] );
    TESTCASE( s[1] == 'a' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[3] );
    TESTCASE( s[3] == 'b' );
    TESTCASE( s[4] == 'c' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[7] );
    TESTCASE( s[6] == '_' );
    TESTCASE( s[7] == 'd' );
    TESTCASE( s[8] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == NULL );
    strcpy( s, "ab_cd" );
    TESTCASE( strtok( s, "_" ) == &s[0] );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[1] == 'b' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[3] );
    TESTCASE( s[3] == 'c' );
    TESTCASE( s[4] == 'd' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == NULL );
    return TEST_RESULTS;
}